

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall
t_c_glib_generator::generate_consts
          (t_c_glib_generator *this,vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  t_type *ttype;
  t_const_value *value;
  bool bVar1;
  ostream *poVar2;
  pointer pptVar3;
  ofstream_with_content_based_conditional_update *poVar4;
  t_c_glib_generator *this_00;
  string name_lc;
  string name_uc;
  string name;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  
  poVar4 = &this->f_types_;
  poVar2 = std::operator<<((ostream *)poVar4,"/* constants */");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)&this->f_types_impl_,"/* constants */");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  for (pptVar3 = (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar3 !=
      (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    std::__cxx11::string::string((string *)&name,(string *)&(*pptVar3)->name_);
    std::__cxx11::string::string((string *)&local_70,(string *)&name);
    to_upper_case(&name_uc,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = (t_c_glib_generator *)&stack0xffffffffffffffb0;
    std::__cxx11::string::string((string *)this_00,(string *)&name);
    to_lower_case(&name_lc,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    ttype = (*pptVar3)->type_;
    value = (*pptVar3)->value_;
    bVar1 = is_complex_type(this_00,ttype);
    if (bVar1) {
      type_name_abi_cxx11_(&local_90,this,ttype,false,false);
      poVar2 = std::operator<<((ostream *)poVar4,(string *)&local_90);
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_b0);
      poVar2 = std::operator<<(poVar2,(string *)&this->nspace_lc);
      poVar2 = std::operator<<(poVar2,(string *)&name_lc);
      poVar2 = std::operator<<(poVar2,"_constant();");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar2 = std::operator<<((ostream *)poVar4,(string *)&local_90);
    poVar2 = std::operator<<(poVar2,"#define ");
    poVar2 = std::operator<<(poVar2,(string *)&this->nspace_uc);
    poVar2 = std::operator<<(poVar2,(string *)&name_uc);
    poVar2 = std::operator<<(poVar2," ");
    std::__cxx11::string::string((string *)&local_d0,(string *)&name_lc);
    constant_value(&local_b0,this,&local_d0,ttype,value);
    poVar2 = std::operator<<(poVar2,(string *)&local_b0);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_f0,(string *)&name_lc);
    generate_const_initializer(this,&local_f0,ttype,value,true);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&name_lc);
    std::__cxx11::string::~string((string *)&name_uc);
    std::__cxx11::string::~string((string *)&name);
  }
  std::operator<<((ostream *)poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&this->f_types_impl_,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_c_glib_generator::generate_consts(vector<t_const*> consts) {
  f_types_ << "/* constants */" << endl;
  f_types_impl_ << "/* constants */" << endl;

  vector<t_const*>::iterator c_iter;
  for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
    string name = (*c_iter)->get_name();
    string name_uc = to_upper_case(name);
    string name_lc = to_lower_case(name);
    t_type* type = (*c_iter)->get_type();
    t_const_value* value = (*c_iter)->get_value();

    if (is_complex_type(type)) {
      f_types_ << type_name(type) << indent() << this->nspace_lc << name_lc
               << "_constant();" << endl;
    }

    f_types_ << indent() << "#define " << this->nspace_uc << name_uc << " "
             << constant_value(name_lc, type, value) << endl;

    generate_const_initializer(name_lc, type, value, true);
  }

  f_types_ << endl;
  f_types_impl_ << endl;
}